

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  undefined8 uVar1;
  VertexType VVar2;
  Vector3f wiRender;
  Float FVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector3f woRender;
  Float pdf;
  Float unused;
  Float local_ac;
  Vector3f local_a8;
  float local_9c;
  undefined1 local_98 [16];
  Float local_84;
  RayDifferential local_80;
  
  if (this->type == Light) {
    FVar3 = PdfLight(this,integrator,next);
    return FVar3;
  }
  local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
       ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
       ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                          ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  auVar7._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
  auVar7._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
  auVar7._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
  auVar7._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
  uVar1 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                          ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  auVar13._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
  auVar13._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
  auVar13._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
  auVar13._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
  auVar10 = vsubps_avx(auVar7,auVar13);
  uVar1 = vmovlps_avx(auVar10);
  local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_a8.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
  FVar3 = 0.0;
  fVar4 = auVar10._0_4_;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar4 = auVar10._0_4_;
    }
    auVar10._4_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar10._0_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar10._8_8_ = 0;
    auVar14._4_4_ = fVar4;
    auVar14._0_4_ = fVar4;
    auVar14._8_4_ = fVar4;
    auVar14._12_4_ = fVar4;
    auVar10 = vdivps_avx(auVar10,auVar14);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z / fVar4;
    uVar1 = vmovlps_avx(auVar10);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    if (prev == (Vertex *)0x0) {
      if (this->type != Camera) {
        LogFatal<char_const(&)[27]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                   ,0x6e0,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
      }
      auVar7 = ZEXT816(0) << 0x20;
      auVar10 = ZEXT816(0);
    }
    else {
      fVar4 = ((prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
              (prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
              ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
              (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      uVar1 = *(undefined8 *)
               &(prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar10 = vinsertps_avx(ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                            super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low
                                     ),ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                                     super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar8._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
      auVar8._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
      auVar8._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
      auVar8._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
      uVar1 = *(undefined8 *)
               &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar10 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                              ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                            super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high),0x10);
      auVar12._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
      auVar12._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
      auVar12._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
      auVar12._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
      auVar7 = vsubps_avx(auVar8,auVar12);
      auVar9._0_4_ = auVar7._0_4_ * auVar7._0_4_;
      auVar9._4_4_ = auVar7._4_4_ * auVar7._4_4_;
      auVar9._8_4_ = auVar7._8_4_ * auVar7._8_4_;
      auVar9._12_4_ = auVar7._12_4_ * auVar7._12_4_;
      auVar10 = vmovshdup_avx(auVar9);
      auVar10 = vfmadd231ss_fma(auVar10,auVar7,auVar7);
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      fVar5 = auVar10._0_4_;
      if ((fVar5 == 0.0) && (!NAN(fVar5))) {
        return 0.0;
      }
      if (fVar5 < 0.0) {
        local_9c = fVar4;
        local_98 = auVar7;
        fVar5 = sqrtf(fVar5);
        fVar4 = local_9c;
        auVar7 = local_98;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar5 = auVar10._0_4_;
      }
      auVar11._4_4_ = fVar5;
      auVar11._0_4_ = fVar5;
      auVar11._8_4_ = fVar5;
      auVar11._12_4_ = fVar5;
      auVar10 = vdivps_avx(auVar7,auVar11);
      auVar7 = ZEXT416((uint)(fVar4 / fVar5));
    }
    local_ac = 0.0;
    VVar2 = this->type;
    if (VVar2 == Medium) {
      auVar13 = vmovshdup_avx(auVar10);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ *
                                              local_a8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                auVar10,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x)
                               );
      auVar7 = vfmadd231ss_fma(auVar10,auVar7,
                               ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
      fVar4 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 + fVar4)),auVar7,auVar10);
      auVar10 = vfnmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),
                                 SUB6416(ZEXT464(0x3f800000),0));
      fVar4 = auVar10._0_4_ * 0.07957747;
      auVar10 = vmaxss_avx(auVar7,ZEXT816(0));
      if (auVar10._0_4_ < 0.0) {
        local_98._0_4_ = fVar4;
        local_9c = auVar7._0_4_;
        fVar6 = sqrtf(auVar10._0_4_);
        fVar4 = (float)local_98._0_4_;
        fVar5 = local_9c;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar6 = auVar10._0_4_;
        fVar5 = auVar7._0_4_;
      }
      local_ac = fVar4 / (fVar6 * fVar5);
    }
    else if (VVar2 == Surface) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
      woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar10._0_8_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar7._0_4_;
      local_ac = BSDF::PDF(&this->bsdf,woRender,wiRender,Radiance,All);
    }
    else {
      if (VVar2 != Camera) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x6eb,"Vertex::PDF(): Unimplemented");
      }
      Interaction::SpawnRay(&local_80,&(this->field_2).ei.super_Interaction,&local_a8);
      CameraHandle::PDF_We
                ((CameraHandle *)&(this->field_2).mi.phase,&local_80.super_Ray,&local_84,&local_ac);
    }
    FVar3 = ConvertDensity(this,local_ac,next);
  }
  return FVar3;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PdfLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }